

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_test.cpp
# Opt level: O0

void __thiscall test_app::reset_context(test_app *this,bool async,bool gzip,bool set_cache)

{
  undefined8 uVar1;
  string *psVar2;
  void *this_00;
  bool bVar3;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  test_app *in_stack_000001a0;
  bool in_stack_000001ae;
  bool in_stack_000001af;
  test_app *in_stack_000001b0;
  allocator local_31;
  string local_30 [37];
  byte local_b;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_b = in_CL & 1;
  set_context(in_stack_000001b0,in_stack_000001af,in_stack_000001ae);
  if ((local_9 & 1) == 0) {
    if ((local_a & 1) == 0) {
      uVar1 = cppcms::application::response();
      cppcms::http::response::io_mode(uVar1,1);
    }
  }
  else {
    uVar1 = cppcms::application::response();
    cppcms::http::response::io_mode(uVar1,3);
    bVar3 = (bool)cppcms::application::response();
    cppcms::http::response::full_asynchronous_buffering(bVar3);
  }
  if ((local_b & 1) != 0) {
    psVar2 = (string *)cppcms::application::cache();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"none",&local_31);
    cppcms::cache_interface::fetch_page(psVar2);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  cppcms::application::response();
  this_00 = (void *)cppcms::http::response::out();
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  ignore_headers(in_stack_000001a0);
  return;
}

Assistant:

void reset_context(bool async,bool gzip,bool set_cache)
	{
		set_context(false,false);
		if(async) {
			response().io_mode(cppcms::http::response::asynchronous);
			response().full_asynchronous_buffering(false);
		}
		else {
			if(!gzip)
				response().io_mode(cppcms::http::response::nogzip);
		}
		if(set_cache)
			cache().fetch_page("none");
		response().out() << std::flush;
		ignore_headers();	
	}